

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_03;
  char *pcVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  p_00 = Vec_PtrAlloc(100);
  p_01 = Vec_PtrAlloc(100);
  p_02 = Vec_PtrAlloc(100);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < nPos) {
    uVar9 = (ulong)(uint)nPos;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pGVar3 = Gia_ManPo(p,pPos[uVar8]);
    Vec_PtrPush(p_02,pGVar3);
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar6 = 0; iVar6 < p_02->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar6);
    Gia_ManDupCones_rec(p,pGVar3,p_00,p_01,p_02);
  }
  Vec_PtrSort(p_00,Gia_ObjCompareByCioId);
  p_03 = Gia_ManStart(p_02->nSize + p_00->nSize + p_01->nSize + 1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_03->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_03->pSpec = pcVar4;
  p->pObjs->Value = 0;
  iVar6 = nPos;
  if (fTrimPis == 0) {
    iVar7 = 0;
    while ((iVar7 < p->vCis->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCi(p,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ManAppendCi(p_03);
      pGVar3->Value = uVar2;
      iVar7 = iVar7 + 1;
    }
  }
  else {
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      pvVar5 = Vec_PtrEntry(p_00,iVar7);
      iVar1 = Gia_ManAppendCi(p_03);
      *(int *)((long)pvVar5 + 8) = iVar1;
    }
  }
  for (; iVar6 < p_02->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar6);
    uVar2 = Gia_ManAppendCi(p_03);
    pGVar3 = Gia_ObjRiToRo(p,pGVar3);
    pGVar3->Value = uVar2;
  }
  for (iVar6 = 0; iVar6 < p_01->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_01,iVar6);
    iVar7 = Gia_ObjFanin0Copy(pGVar3);
    iVar1 = Gia_ObjFanin1Copy(pGVar3);
    uVar2 = Gia_ManAppendAnd(p_03,iVar7,iVar1);
    pGVar3->Value = uVar2;
  }
  for (iVar6 = 0; iVar6 < p_02->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar6);
    iVar7 = Gia_ObjFanin0Copy(pGVar3);
    Gia_ManAppendCo(p_03,iVar7);
  }
  Gia_ManSetRegNum(p_03,p_02->nSize - nPos);
  Vec_PtrFree(p_00);
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  return p_03;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}